

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-unexpected-read.c
# Opt level: O2

int run_test_tcp_unexpected_read(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  undefined8 uStack_20;
  sockaddr_in addr;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_timer_init(puVar2,&timer_handle);
    if (iVar1 == 0) {
      iVar1 = uv_timer_start(&timer_handle,timer_cb,1000,0);
      if (iVar1 == 0) {
        iVar1 = uv_check_init(puVar2,&check_handle);
        if (iVar1 == 0) {
          iVar1 = uv_check_start(&check_handle,check_cb);
          if (iVar1 == 0) {
            iVar1 = uv_tcp_init(puVar2,&server_handle);
            if (iVar1 == 0) {
              iVar1 = uv_tcp_init(puVar2,&client_handle);
              if (iVar1 == 0) {
                iVar1 = uv_tcp_init(puVar2,&peer_handle);
                if (iVar1 == 0) {
                  iVar1 = uv_tcp_bind(&server_handle,(sockaddr *)&addr,0);
                  if (iVar1 == 0) {
                    iVar1 = uv_listen((uv_stream_t *)&server_handle,1,connection_cb);
                    if (iVar1 == 0) {
                      iVar1 = uv_tcp_connect(&connect_req,&client_handle,(sockaddr *)&addr,
                                             connect_cb);
                      if (iVar1 == 0) {
                        iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
                        if (iVar1 == 0) {
                          if (ticks < 0x15) {
                            puVar2 = uv_default_loop();
                            uv_walk(puVar2,close_walk_cb,(void *)0x0);
                            uv_run(puVar2,UV_RUN_DEFAULT);
                            puVar2 = uv_default_loop();
                            iVar1 = uv_loop_close(puVar2);
                            if (iVar1 == 0) {
                              return 0;
                            }
                            pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                            uStack_20 = 0x73;
                          }
                          else {
                            pcVar3 = "ticks <= 20";
                            uStack_20 = 0x71;
                          }
                        }
                        else {
                          pcVar3 = "0 == uv_run(loop, UV_RUN_DEFAULT)";
                          uStack_20 = 0x6b;
                        }
                      }
                      else {
                        pcVar3 = 
                        "0 == uv_tcp_connect(&connect_req, &client_handle, (const struct sockaddr*) &addr, connect_cb)"
                        ;
                        uStack_20 = 0x6a;
                      }
                    }
                    else {
                      pcVar3 = "0 == uv_listen((uv_stream_t*) &server_handle, 1, connection_cb)";
                      uStack_20 = 0x66;
                    }
                  }
                  else {
                    pcVar3 = "0 == uv_tcp_bind(&server_handle, (const struct sockaddr*) &addr, 0)";
                    uStack_20 = 0x65;
                  }
                }
                else {
                  pcVar3 = "0 == uv_tcp_init(loop, &peer_handle)";
                  uStack_20 = 100;
                }
              }
              else {
                pcVar3 = "0 == uv_tcp_init(loop, &client_handle)";
                uStack_20 = 99;
              }
            }
            else {
              pcVar3 = "0 == uv_tcp_init(loop, &server_handle)";
              uStack_20 = 0x62;
            }
          }
          else {
            pcVar3 = "0 == uv_check_start(&check_handle, check_cb)";
            uStack_20 = 0x61;
          }
        }
        else {
          pcVar3 = "0 == uv_check_init(loop, &check_handle)";
          uStack_20 = 0x60;
        }
      }
      else {
        pcVar3 = "0 == uv_timer_start(&timer_handle, timer_cb, 1000, 0)";
        uStack_20 = 0x5f;
      }
    }
    else {
      pcVar3 = "0 == uv_timer_init(loop, &timer_handle)";
      uStack_20 = 0x5e;
    }
  }
  else {
    pcVar3 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
    uStack_20 = 0x5b;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-unexpected-read.c"
          ,uStack_20,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(tcp_unexpected_read) {
  struct sockaddr_in addr;
  uv_loop_t* loop;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  loop = uv_default_loop();

  ASSERT(0 == uv_timer_init(loop, &timer_handle));
  ASSERT(0 == uv_timer_start(&timer_handle, timer_cb, 1000, 0));
  ASSERT(0 == uv_check_init(loop, &check_handle));
  ASSERT(0 == uv_check_start(&check_handle, check_cb));
  ASSERT(0 == uv_tcp_init(loop, &server_handle));
  ASSERT(0 == uv_tcp_init(loop, &client_handle));
  ASSERT(0 == uv_tcp_init(loop, &peer_handle));
  ASSERT(0 == uv_tcp_bind(&server_handle, (const struct sockaddr*) &addr, 0));
  ASSERT(0 == uv_listen((uv_stream_t*) &server_handle, 1, connection_cb));
  ASSERT(0 == uv_tcp_connect(&connect_req,
                             &client_handle,
                             (const struct sockaddr*) &addr,
                             connect_cb));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));

  /* This is somewhat inexact but the idea is that the event loop should not
   * start busy looping when the server sends a message and the client isn't
   * reading.
   */
  ASSERT(ticks <= 20);

  MAKE_VALGRIND_HAPPY();
  return 0;
}